

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

idx_t __thiscall
duckdb::JoinHashTable::GetTotalSize
          (JoinHashTable *this,vector<unsigned_long,_true> *partition_sizes,
          vector<unsigned_long,_true> *partition_counts,idx_t *max_partition_size,
          idx_t *max_partition_count)

{
  value_type vVar1;
  const_reference pvVar2;
  idx_t iVar3;
  idx_t iVar4;
  long lVar5;
  idx_t count;
  idx_t i;
  ulong __n;
  ulong local_60;
  
  iVar4 = this->radix_bits;
  *max_partition_size = 0;
  *max_partition_count = 0;
  lVar5 = 0;
  count = 0;
  local_60 = 0;
  for (__n = 0; __n >> ((byte)iVar4 & 0x3f) == 0; __n = __n + 1) {
    pvVar2 = vector<unsigned_long,_true>::get<true>(partition_sizes,__n);
    lVar5 = lVar5 + *pvVar2;
    pvVar2 = vector<unsigned_long,_true>::get<true>(partition_counts,__n);
    count = count + *pvVar2;
    pvVar2 = vector<unsigned_long,_true>::get<true>(partition_sizes,__n);
    vVar1 = *pvVar2;
    pvVar2 = vector<unsigned_long,_true>::get<true>(partition_counts,__n);
    iVar3 = PointerTableSize(this,*pvVar2);
    if (local_60 < iVar3 + vVar1) {
      pvVar2 = vector<unsigned_long,_true>::get<true>(partition_sizes,__n);
      *max_partition_size = *pvVar2;
      pvVar2 = vector<unsigned_long,_true>::get<true>(partition_counts,__n);
      *max_partition_count = *pvVar2;
      local_60 = iVar3 + vVar1;
    }
  }
  if (count == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = PointerTableSize(this,count);
    iVar4 = iVar4 + lVar5;
  }
  return iVar4;
}

Assistant:

idx_t JoinHashTable::GetTotalSize(const vector<idx_t> &partition_sizes, const vector<idx_t> &partition_counts,
                                  idx_t &max_partition_size, idx_t &max_partition_count) const {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);

	idx_t total_size = 0;
	idx_t total_count = 0;
	idx_t max_partition_ht_size = 0;
	max_partition_size = 0;
	max_partition_count = 0;
	for (idx_t i = 0; i < num_partitions; i++) {
		total_size += partition_sizes[i];
		total_count += partition_counts[i];

		auto partition_size = partition_sizes[i] + PointerTableSize(partition_counts[i]);
		if (partition_size > max_partition_ht_size) {
			max_partition_ht_size = partition_size;
			max_partition_size = partition_sizes[i];
			max_partition_count = partition_counts[i];
		}
	}

	if (total_count == 0) {
		return 0;
	}

	return total_size + PointerTableSize(total_count);
}